

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backup.c
# Opt level: O3

ssize_t add_all_files(int fd,char *parent,char *rel,char *host)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  char cVar9;
  int iVar10;
  DIR *__dirp;
  dirent *pdVar11;
  tm *ptVar12;
  ulong uVar13;
  size_t nbyte;
  char *pcVar14;
  uint uVar15;
  ssize_t sVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  stat st;
  char new_rel [256];
  char new_host [1024];
  stat local_fc8;
  undefined1 local_f38 [16];
  uint local_f28 [2];
  size_t local_f20;
  undefined4 local_f18;
  undefined8 local_f14;
  undefined4 local_f0c;
  undefined4 local_f08;
  undefined8 local_f04;
  undefined4 local_efc;
  undefined4 local_ef8;
  undefined8 local_ef4;
  undefined1 local_eec [12];
  undefined4 uStack_ee0;
  undefined1 auStack_edc [12];
  char local_ed0 [256];
  undefined4 local_dd0;
  char local_dcc [1160];
  undefined8 local_944;
  undefined4 local_93c;
  char local_938 [256];
  char local_838 [1032];
  undefined8 local_430;
  undefined1 local_428 [1004];
  undefined8 local_3c;
  undefined4 local_34;
  
  __dirp = opendir(host);
  if (__dirp == (DIR *)0x0) {
    fprintf(_stderr,"cannot open %s\n",host);
LAB_001037a0:
    sVar16 = -1;
  }
  else {
    pdVar11 = readdir(__dirp);
    if (pdVar11 == (dirent *)0x0) {
      sVar16 = 0;
    }
    else {
      sVar16 = 0;
      do {
        while (((cVar9 = *rel, cVar9 == '\0' &&
                (iVar10 = strcmp(pdVar11->d_name,"VITA_PATH.TXT"), iVar10 == 0)) ||
               ((pdVar11->d_name[0] == '.' &&
                ((pdVar11->d_name[1] == '\0' ||
                 ((pdVar11->d_name[1] == '.' && (pdVar11->d_name[2] == '\0'))))))))) {
          pdVar11 = readdir(__dirp);
          if (pdVar11 == (dirent *)0x0) goto LAB_00103703;
        }
        pcVar14 = pdVar11->d_name;
        if ((cVar9 != '\0') || (iVar10 = strcmp(pcVar14,"VITA_DATA.BIN"), iVar10 != 0)) {
          iVar10 = snprintf(local_938,0x100,"%s/%s",rel,pcVar14);
          if (iVar10 != 0x100) goto LAB_0010332c;
          fprintf(_stderr,"path is too long! cannot add %s/%s\n",rel,pcVar14);
LAB_00103798:
          closedir(__dirp);
          goto LAB_001037a0;
        }
        local_938[0] = '\0';
LAB_0010332c:
        snprintf(local_838,0x400,"%s/%s",host,pcVar14);
        memset(local_f28,0x78,0x5f0);
        local_f38 = (undefined1  [16])0x0;
        iVar10 = stat(local_838,&local_fc8);
        if (iVar10 < 0) {
          pcVar14 = "error getting stat for %s\n";
LAB_00103782:
          fprintf(_stderr,pcVar14,local_838);
          goto LAB_00103798;
        }
        local_f28[0] = ((local_fc8.st_mode & 6) << 6 |
                       local_fc8.st_mode & 0x30 | local_fc8.st_mode >> 6 & 6) +
                       (uint)((local_fc8.st_mode & 0xf000) != 0x4000) * 0x1000 + 0x1000;
        local_f28[1] = 0;
        local_f20 = local_fc8.st_size;
        ptVar12 = localtime(&local_fc8.st_ctim.tv_sec);
        auVar17._0_4_ = ptVar12->tm_sec;
        auVar17._4_4_ = ptVar12->tm_min;
        auVar17._8_4_ = ptVar12->tm_hour;
        auVar17._12_4_ = ptVar12->tm_mday;
        auVar17 = pshufb(auVar17,_DAT_00107240);
        local_f14 = auVar17._0_8_;
        uVar1 = ptVar12->tm_mon;
        uVar4 = ptVar12->tm_year;
        auVar18._4_4_ = uVar4;
        auVar18._0_4_ = uVar1;
        auVar18._8_8_ = 0;
        auVar17 = pshuflw(auVar18,auVar18,0xe2);
        local_f18 = CONCAT22(auVar17._2_2_ + 1,auVar17._0_2_ + 0x76c);
        local_f0c = 0;
        ptVar12 = localtime(&local_fc8.st_atim.tv_sec);
        auVar7._0_4_ = ptVar12->tm_sec;
        auVar7._4_4_ = ptVar12->tm_min;
        auVar7._8_4_ = ptVar12->tm_hour;
        auVar7._12_4_ = ptVar12->tm_mday;
        auVar17 = pshufb(auVar7,_DAT_00107240);
        local_f04 = auVar17._0_8_;
        uVar2 = ptVar12->tm_mon;
        uVar5 = ptVar12->tm_year;
        auVar19._4_4_ = uVar5;
        auVar19._0_4_ = uVar2;
        auVar19._8_8_ = 0;
        auVar17 = pshuflw(auVar19,auVar19,0xe2);
        local_f08 = CONCAT22(auVar17._2_2_ + 1,auVar17._0_2_ + 0x76c);
        local_efc = 0;
        ptVar12 = localtime(&local_fc8.st_mtim.tv_sec);
        auVar8._0_4_ = ptVar12->tm_sec;
        auVar8._4_4_ = ptVar12->tm_min;
        auVar8._8_4_ = ptVar12->tm_hour;
        auVar8._12_4_ = ptVar12->tm_mday;
        auVar17 = pshufb(auVar8,_DAT_00107240);
        local_ef4 = auVar17._0_8_;
        uVar3 = ptVar12->tm_mon;
        uVar6 = ptVar12->tm_year;
        auVar20._4_4_ = uVar6;
        auVar20._0_4_ = uVar3;
        auVar20._8_8_ = 0;
        auVar17 = pshuflw(auVar20,auVar20,0xe2);
        local_ef8 = CONCAT22(auVar17._2_2_ + 1,auVar17._0_2_ + 0x76c);
        auStack_edc = SUB1612((undefined1  [16])0x0,4);
        local_eec = SUB1612((undefined1  [16])0x0,0);
        uStack_ee0 = 0;
        strncpy(local_ed0,parent,0x100);
        local_dd0 = 1;
        strncpy(local_dcc,local_938,0x100);
        local_944 = 0x616548664f646e45;
        local_93c = 0xa726564;
        write_block(fd,local_f38,0x600);
        nbyte = local_f20;
        if ((local_f28[0] & 0xf000) == 0x2000) {
          printf("packing file %s%s (%llx bytes)...\n",local_ed0,local_dcc,local_f20);
          iVar10 = open(local_838,0);
          if (iVar10 < 0) {
            pcVar14 = "error opening %s\n";
            goto LAB_00103782;
          }
          uVar13 = copy_block(fd,iVar10,nbyte);
          if (uVar13 < nbyte) {
            add_all_files_cold_1();
            goto LAB_00103798;
          }
          close(iVar10);
          if ((nbyte & 0x3ff) != 0) {
            uVar15 = 0x401 - (int)(nbyte & 0x3ff);
            do {
              local_fc8.st_dev._0_1_ = 0x2b;
              if (uVar15 == 2) {
                local_fc8.st_dev._0_1_ = 10;
              }
              write_block(fd,&local_fc8,1);
              uVar15 = uVar15 - 1;
            } while (1 < uVar15);
          }
        }
        else {
          nbyte = 0;
        }
        memset(local_428,0x7a,0x3ec);
        local_430 = 0;
        local_3c = 0x696154664f646e45;
        local_34 = 0xa72656c;
        write_block(fd,&local_430,0x400);
        if ((local_f28[0] & 0xf000) == 0x1000) {
          printf("packing directory %s%s...\n",local_ed0,local_dcc);
          nbyte = add_all_files(fd,parent,local_938,local_838);
        }
        if ((long)nbyte < 0) goto LAB_00103798;
        sVar16 = sVar16 + nbyte;
        pdVar11 = readdir(__dirp);
      } while (pdVar11 != (dirent *)0x0);
    }
LAB_00103703:
    closedir(__dirp);
  }
  return sVar16;
}

Assistant:

static ssize_t add_all_files(int fd, const char *parent, const char *rel, const char *host) {
  char new_rel[256];
  char new_host[MAX_PATH_LEN];
  DIR *dir;
  struct dirent *dent;
  ssize_t fsize, total;

  if ((dir = opendir(host)) == NULL) {
    fprintf(stderr, "cannot open %s\n", host);
    return -1;
  }

  total = 0;
  while ((dent = readdir(dir)) != NULL) {
    if (rel[0] == '\0' && strcmp(dent->d_name, "VITA_PATH.TXT") == 0) {
      // skip this file
      continue;
    }

    if (strcmp(dent->d_name, ".") == 0 || strcmp(dent->d_name, "..") == 0) {
      continue;
    }

#ifdef __APPLE__
    if (strcmp(dent->d_name, ".DS_Store") == 0) {
      continue; // ignore annoying OSX specific files
    }
#endif

    if (rel[0] == '\0' && strcmp(dent->d_name, "VITA_DATA.BIN") == 0) { // special file
      new_rel[0] = '\0';
    } else {
      if (snprintf(new_rel, sizeof(new_rel), "%s/%s", rel, dent->d_name) == sizeof(new_rel)) {
        fprintf(stderr, "path is too long! cannot add %s/%s\n", rel, dent->d_name);
        goto err;
      }
    }
    snprintf(new_host, sizeof(new_host), "%s/%s", host, dent->d_name);

    dent = NULL; // so we don't actually reuse it
    // add file/directory to psvimg
    if ((fsize = add_file(fd, parent, new_rel, new_host)) < 0) {
      goto err;
    }
    total += fsize;
  }

  closedir(dir);
  return total;

err:
  closedir(dir);
  return -1;
}